

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTaggerValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)2001>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  Pipeline *pPVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Type *pTVar17;
  long *plVar18;
  undefined1 *puVar19;
  ostream *poVar20;
  size_type *psVar21;
  int iVar22;
  size_type sVar23;
  char *pcVar24;
  _Alloc_hider _Var25;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  bool bVar26;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator_type local_221;
  Pipeline *local_220;
  undefined1 local_218 [8];
  _Alloc_hider local_210;
  undefined1 local_208 [24];
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  RepeatedPtrFieldBase *local_1e0;
  Result *local_1d8;
  ModelDescription *local_1d0;
  TypeCase local_1c4;
  CoreML *local_1c0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = format->description_;
  if (local_1d0 == (ModelDescription *)0x0) {
    local_1d0 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x7d1) {
    local_220 = (format->Type_).pipeline_;
    uVar2._0_4_ = (local_220->models_).super_RepeatedPtrFieldBase.current_size_;
    uVar2._4_4_ = (local_220->models_).super_RepeatedPtrFieldBase.total_size_;
    bVar26 = *(long *)(((ulong)(local_220->models_).super_RepeatedPtrFieldBase.rep_ &
                       0xfffffffffffffffe) + 8) != 0;
    uVar12 = bVar26 + 1;
    if (*(long *)((uVar2 & 0xfffffffffffffffe) + 8) == 0) {
      uVar12 = (uint)bVar26;
    }
    uVar3._0_4_ = (local_220->names_).super_RepeatedPtrFieldBase.current_size_;
    uVar3._4_4_ = (local_220->names_).super_RepeatedPtrFieldBase.total_size_;
    uVar9 = (uint)(*(long *)((uVar3 & 0xfffffffffffffffe) + 8) == 0);
    uVar12 = (uVar12 - (*(long *)(((ulong)(local_220->names_).super_RepeatedPtrFieldBase.arena_ &
                                  0xfffffffffffffffe) + 8) == 0)) + 2;
    if ((local_1d0->output_).super_RepeatedPtrFieldBase.current_size_ == uVar12 - uVar9) {
      if (uVar12 != uVar9) {
        local_1c0 = (CoreML *)&local_1d0->input_;
        local_1e0 = &(local_1d0->output_).super_RepeatedPtrFieldBase;
        iVar22 = 0;
        local_1e8 = -1;
        local_1e4 = -1;
        local_1ec = -1;
        local_1f0 = -1;
        local_1d8 = __return_storage_ptr__;
        do {
          pPVar11 = local_220;
          pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (local_1e0,iVar22);
          plVar18 = (long *)((ulong)(pTVar17->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar4 = *plVar18;
          local_1b8 = (undefined1  [8])local_1a8;
          std::__cxx11::string::_M_construct<char*>((string *)local_1b8,lVar4,plVar18[1] + lVar4);
          uVar5._0_4_ = (pPVar11->models_).super_RepeatedPtrFieldBase.current_size_;
          uVar5._4_4_ = (pPVar11->models_).super_RepeatedPtrFieldBase.total_size_;
          iVar13 = std::__cxx11::string::compare((string *)(uVar5 & 0xfffffffffffffffe));
          if (iVar13 == 0) {
            local_1e8 = iVar22;
          }
          iVar14 = std::__cxx11::string::compare
                             ((string *)
                              ((ulong)(pPVar11->models_).super_RepeatedPtrFieldBase.rep_ &
                              0xfffffffffffffffe));
          if (iVar14 == 0) {
            local_1e4 = iVar22;
          }
          iVar15 = std::__cxx11::string::compare
                             ((string *)
                              ((ulong)(pPVar11->names_).super_RepeatedPtrFieldBase.arena_ &
                              0xfffffffffffffffe));
          if (iVar15 == 0) {
            local_1ec = iVar22;
          }
          uVar6._0_4_ = (pPVar11->names_).super_RepeatedPtrFieldBase.current_size_;
          uVar6._4_4_ = (pPVar11->names_).super_RepeatedPtrFieldBase.total_size_;
          iVar16 = std::__cxx11::string::compare((string *)(uVar6 & 0xfffffffffffffffe));
          iVar10 = local_1f0;
          if (iVar16 == 0) {
            iVar10 = iVar22;
          }
          if ((((iVar13 != 0) && (iVar14 != 0)) && (iVar15 != 0)) && (iVar16 != 0)) {
            std::operator+(&local_248,"Output feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_248);
            __return_storage_ptr__ = local_1d8;
            psVar21 = (size_type *)(plVar18 + 2);
            if ((size_type *)*plVar18 == psVar21) {
              local_208._0_8_ = *psVar21;
              local_208._8_8_ = plVar18[3];
              local_218 = (undefined1  [8])local_208;
            }
            else {
              local_208._0_8_ = *psVar21;
              local_218 = (undefined1  [8])*plVar18;
            }
            local_210._M_p = (pointer)plVar18[1];
            *plVar18 = (long)psVar21;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            Result::Result(local_1d8,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_218);
            if (local_218 != (undefined1  [8])local_208) {
              operator_delete((void *)local_218,local_208._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            sVar23 = local_1a8._0_8_;
            _Var25._M_p = (pointer)local_1b8;
            if (local_1b8 == (undefined1  [8])local_1a8) {
              return __return_storage_ptr__;
            }
            goto LAB_00318981;
          }
          local_1f0 = iVar10;
          if (local_1b8 != (undefined1  [8])local_1a8) {
            operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
          }
          iVar13 = local_1e4;
          iVar22 = iVar22 + 1;
        } while (iVar22 < (local_1d0->output_).super_RepeatedPtrFieldBase.current_size_);
        __return_storage_ptr__ = local_1d8;
        if (local_1e4 != -1) {
          Result::Result((Result *)local_218);
          local_1c4 = kStringType;
          __l._M_len = 1;
          __l._M_array = &local_1c4;
          std::
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    *)&local_248,__l,&local_221);
          validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                    ((Result *)local_1b8,local_1c0,
                     (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
                     (int)&local_248,in_R8);
          local_218 = local_1b8;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_1b0);
          if (local_1b0._M_p != local_1a8 + 8) {
            operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
          }
          if (local_248._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_248._M_dataplus._M_p,
                            local_248.field_2._M_allocated_capacity -
                            (long)local_248._M_dataplus._M_p);
          }
          bVar26 = Result::good((Result *)local_218);
          __return_storage_ptr__ = local_1d8;
          if (bVar26) {
            uVar12 = (local_1d0->output_).super_RepeatedPtrFieldBase.current_size_;
            local_1c4 = kSequenceType;
            __l_00._M_len = 1;
            __l_00._M_array = &local_1c4;
            std::
            vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      *)&local_248,__l_00,&local_221);
            validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                      ((Result *)local_1b8,(CoreML *)local_1e0,
                       (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(ulong)uVar12,
                       (int)&local_248,in_R8);
            local_218 = local_1b8;
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_1b0);
            if (local_1b0._M_p != local_1a8 + 8) {
              operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
            }
            if (local_248._M_dataplus._M_p != (char *)0x0) {
              operator_delete(local_248._M_dataplus._M_p,
                              local_248.field_2._M_allocated_capacity -
                              (long)local_248._M_dataplus._M_p);
            }
            bVar26 = Result::good((Result *)local_218);
            __return_storage_ptr__ = local_1d8;
            if (!bVar26) goto LAB_00318ad1;
            pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_1e0,iVar13);
            __return_storage_ptr__ = local_1d8;
            puVar19 = (undefined1 *)pTVar17->type_;
            if ((FeatureType *)puVar19 == (FeatureType *)0x0) {
              puVar19 = Specification::_FeatureType_default_instance_;
            }
            if (((FeatureType *)puVar19)->_oneof_case_[0] == 7) {
              puVar19 = (undefined1 *)(((FeatureType *)puVar19)->Type_).sequencetype_;
            }
            else {
              puVar19 = Specification::_SequenceFeatureType_default_instance_;
            }
            if (((SequenceFeatureType *)puVar19)->_oneof_case_[0] == 3) {
              if (local_1e8 != -1) {
                pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                    (local_1e0,local_1e8);
                puVar19 = (undefined1 *)pTVar17->type_;
                if ((FeatureType *)puVar19 == (FeatureType *)0x0) {
                  puVar19 = Specification::_FeatureType_default_instance_;
                }
                if (((FeatureType *)puVar19)->_oneof_case_[0] == 7) {
                  puVar19 = (undefined1 *)(((FeatureType *)puVar19)->Type_).sequencetype_;
                }
                else {
                  puVar19 = Specification::_SequenceFeatureType_default_instance_;
                }
                if (((SequenceFeatureType *)puVar19)->_oneof_case_[0] != 3) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unsupported type \"",0x12);
                  if ((ulong)((SequenceFeatureType *)puVar19)->_oneof_case_[0] < 9) {
                    pcVar24 = (&PTR_anon_var_dwarf_74c646_00490288)
                              [((SequenceFeatureType *)puVar19)->_oneof_case_[0]];
                  }
                  else {
                    pcVar24 = "INVALID";
                  }
                  poVar20 = std::operator<<((ostream *)local_1a8,pcVar24);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,"\" for feature \"",0xf);
                  uVar7._0_4_ = (local_220->models_).super_RepeatedPtrFieldBase.current_size_;
                  uVar7._4_4_ = (local_220->models_).super_RepeatedPtrFieldBase.total_size_;
                  std::operator+(&local_248,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(uVar7 & 0xfffffffffffffffe),"\". Should be: ");
                  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar20,local_248._M_dataplus._M_p,local_248._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,"MLFeatureTypeType_stringType",0x1c);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248)
                  ;
                  goto LAB_003190f3;
                }
              }
              if (local_1ec != -1) {
                pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                    (local_1e0,local_1ec);
                puVar19 = (undefined1 *)pTVar17->type_;
                if ((FeatureType *)puVar19 == (FeatureType *)0x0) {
                  puVar19 = Specification::_FeatureType_default_instance_;
                }
                if (((FeatureType *)puVar19)->_oneof_case_[0] == 7) {
                  puVar19 = (undefined1 *)(((FeatureType *)puVar19)->Type_).sequencetype_;
                }
                else {
                  puVar19 = Specification::_SequenceFeatureType_default_instance_;
                }
                if (((SequenceFeatureType *)puVar19)->_oneof_case_[0] != 1) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unsupported type \"",0x12);
                  if ((ulong)((SequenceFeatureType *)puVar19)->_oneof_case_[0] < 9) {
                    pcVar24 = (&PTR_anon_var_dwarf_74c646_00490288)
                              [((SequenceFeatureType *)puVar19)->_oneof_case_[0]];
                  }
                  else {
                    pcVar24 = "INVALID";
                  }
                  poVar20 = std::operator<<((ostream *)local_1a8,pcVar24);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,"\" for feature \"",0xf);
                  std::operator+(&local_248,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((ulong)(local_220->names_).super_RepeatedPtrFieldBase.arena_ &
                                    0xfffffffffffffffe),"\". Should be: ");
                  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar20,local_248._M_dataplus._M_p,local_248._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,"MLFeatureTypeType_int64Type",0x1b);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248)
                  ;
                  goto LAB_003190f3;
                }
              }
              if (local_1f0 != -1) {
                pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                    (local_1e0,local_1f0);
                puVar19 = (undefined1 *)pTVar17->type_;
                if ((FeatureType *)puVar19 == (FeatureType *)0x0) {
                  puVar19 = Specification::_FeatureType_default_instance_;
                }
                if (((FeatureType *)puVar19)->_oneof_case_[0] == 7) {
                  puVar19 = (undefined1 *)(((FeatureType *)puVar19)->Type_).sequencetype_;
                }
                else {
                  puVar19 = Specification::_SequenceFeatureType_default_instance_;
                }
                if (((SequenceFeatureType *)puVar19)->_oneof_case_[0] != 1) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unsupported type \"",0x12);
                  if ((ulong)((SequenceFeatureType *)puVar19)->_oneof_case_[0] < 9) {
                    pcVar24 = (&PTR_anon_var_dwarf_74c646_00490288)
                              [((SequenceFeatureType *)puVar19)->_oneof_case_[0]];
                  }
                  else {
                    pcVar24 = "INVALID";
                  }
                  poVar20 = std::operator<<((ostream *)local_1a8,pcVar24);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,"\" for feature \"",0xf);
                  uVar8._0_4_ = (local_220->names_).super_RepeatedPtrFieldBase.current_size_;
                  uVar8._4_4_ = (local_220->names_).super_RepeatedPtrFieldBase.total_size_;
                  std::operator+(&local_248,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(uVar8 & 0xfffffffffffffffe),"\". Should be: ");
                  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar20,local_248._M_dataplus._M_p,local_248._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,"MLFeatureTypeType_int64Type",0x1b);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248)
                  ;
                  goto LAB_003190f3;
                }
              }
              if ((local_220->_cached_size_).size_.super___atomic_base<int>._M_i == 0) {
                local_1b8 = (undefined1  [8])local_1a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b8,"Model revision number not set. Must be >= 1","");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
              }
              else {
                iVar22 = *(int *)((long)&local_220[1].super_MessageLite._internal_metadata_.ptr_ + 4
                                 );
                if ((iVar22 == 0) ||
                   ((iVar22 == 200 &&
                    (*(int *)(local_220[1].super_MessageLite._vptr_MessageLite + 3) < 1)))) {
                  local_1b8 = (undefined1  [8])local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1b8,
                             "Model output tags not set. Must have at least one tag","");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8
                                );
                }
                else {
                  if (*(long *)(((ulong)(local_220->names_).super_RepeatedPtrFieldBase.rep_ &
                                0xfffffffffffffffe) + 8) != 0) goto LAB_00318ad1;
                  local_1b8 = (undefined1  [8])local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1b8,"Model parameter data not set","");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8
                                );
                }
              }
              if (local_1b8 != (undefined1  [8])local_1a8) {
                operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
              }
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unsupported type \"",0x12);
              if ((ulong)((SequenceFeatureType *)puVar19)->_oneof_case_[0] < 9) {
                pcVar24 = (&PTR_anon_var_dwarf_74c646_00490288)
                          [((SequenceFeatureType *)puVar19)->_oneof_case_[0]];
              }
              else {
                pcVar24 = "INVALID";
              }
              poVar20 = std::operator<<((ostream *)local_1a8,pcVar24);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\" for feature \"",0xf);
              std::operator+(&local_248,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(local_220->models_).super_RepeatedPtrFieldBase.rep_ &
                             0xfffffffffffffffe),"\". Should be: ");
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar20,local_248._M_dataplus._M_p,local_248._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,"MLFeatureTypeType_stringType",0x1c);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248);
LAB_003190f3:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
            }
          }
          else {
LAB_00318ad1:
            __return_storage_ptr__->m_type = local_218._0_4_;
            __return_storage_ptr__->m_reason = local_218._4_4_;
            paVar1 = &(__return_storage_ptr__->m_message).field_2;
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
            if (local_210._M_p == local_208 + 8) {
              paVar1->_M_allocated_capacity = local_208._8_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                   local_208._16_8_;
            }
            else {
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_210._M_p;
              (__return_storage_ptr__->m_message).field_2._M_allocated_capacity = local_208._8_8_;
            }
            (__return_storage_ptr__->m_message)._M_string_length = local_208._0_8_;
            local_208._0_8_ = 0;
            local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
            local_210._M_p = local_208 + 8;
          }
          sVar23 = local_208._8_8_;
          _Var25._M_p = local_210._M_p;
          if (local_210._M_p == local_208 + 8) {
            return __return_storage_ptr__;
          }
          goto LAB_00318981;
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     "Expected feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(local_220->models_).super_RepeatedPtrFieldBase.rep_ &
                     0xfffffffffffffffe));
      plVar18 = (long *)std::__cxx11::string::append((char *)local_218);
      psVar21 = (size_type *)(plVar18 + 2);
      if ((size_type *)*plVar18 == psVar21) {
        local_1a8._0_8_ = *psVar21;
        local_1a8._8_8_ = plVar18[3];
        local_1b8 = (undefined1  [8])local_1a8;
      }
      else {
        local_1a8._0_8_ = *psVar21;
        local_1b8 = (undefined1  [8])*plVar18;
      }
      local_1b0._M_p = (pointer)plVar18[1];
      *plVar18 = (long)psVar21;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
      }
      sVar23 = local_208._0_8_;
      _Var25._M_p = (pointer)local_218;
      if (local_218 == (undefined1  [8])local_208) {
        return __return_storage_ptr__;
      }
      goto LAB_00318981;
    }
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,
               "More model output features than the output features of the word tagger model.","");
    Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_1b8);
  }
  else {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Model not a word tagger.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
  }
  sVar23 = local_1a8._0_8_;
  _Var25._M_p = (pointer)local_1b8;
  if (local_1b8 == (undefined1  [8])local_1a8) {
    return __return_storage_ptr__;
  }
LAB_00318981:
  operator_delete(_Var25._M_p,sVar23 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordTagger>(const Specification::Model& format) {
        const auto& interface = format.description();
        const auto& inputs = interface.input();
        const auto& outputs = interface.output();
        
        // make sure model is a word tager
        if (!format.has_wordtagger()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word tagger.");
        }
        
        const auto& wordTagger = format.wordtagger();
        
        int numNonEmptyOutputFeatures = 0;
        
        if (wordTagger.tokentagsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokensoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlocationsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlengthsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (outputs.size() != numNonEmptyOutputFeatures) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                          "More model output features than the output features of the word tagger model.");
        }        
        
        int tokensOutputIndex = -1;
        int tokenTagsOutputIndex = -1;
        int tokenLocationsOutputIndex = -1;
        int tokenLengthsOutputIndex = -1;
        
        // check that any interface output can be found from word tagger outputs
        for (int i = 0; i < outputs.size(); i++) {
            const std::string name = outputs[i].name();
            bool present = false;
            
            if (wordTagger.tokensoutputfeaturename().compare(name) == 0) {
                tokensOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokentagsoutputfeaturename().compare(name) == 0) {
                tokenTagsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlocationsoutputfeaturename().compare(name) == 0) {
                tokenLocationsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlengthsoutputfeaturename().compare(name) == 0) {
                tokenLengthsOutputIndex = i;
                present = true;
            }
            
            if (!present) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not required by the output features of the word tagger model.");
            }
        }
        
        // token tags is the required output feature name, while tokens/locations/lengths are optional
        if (tokenTagsOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + wordTagger.tokentagsoutputfeaturename() + "' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(inputs, 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only sequence type is allowed for any output
        result = validateDescriptionsContainFeatureWithTypes(outputs, outputs.size(), {Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // validate the individual output type, token tags has to be a sequence of strings
        const auto& tokenTagsOutputSequenceType = outputs[tokenTagsOutputIndex].type().sequencetype();
        if (tokenTagsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenTagsOutputSequenceType.Type_case()))
            << "\" for feature \"" << wordTagger.tokentagsoutputfeaturename() + "\". Should be: "
            << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
            
            return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
        }

        // validate the individual output type, tokens (if present) has to be a sequence of strings
        if (tokensOutputIndex != -1) {
            const auto& tokensOutputSequenceType = outputs[tokensOutputIndex].type().sequencetype();
            if (tokensOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokensOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokensoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token locations (if present) has to be a sequence of integers
        if (tokenLocationsOutputIndex != -1) {
            const auto& tokenLocationsOutputSequenceType = outputs[tokenLocationsOutputIndex].type().sequencetype();
            if (tokenLocationsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLocationsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlocationsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token lengths (if present) has to be a sequence of integers
        if (tokenLengthsOutputIndex != -1) {
            const auto& tokenLengthsOutputSequenceType = outputs[tokenLengthsOutputIndex].type().sequencetype();
            if (tokenLengthsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLengthsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlengthsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // Validate the model parameters
        if (wordTagger.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }

        int numTags;
        switch (wordTagger.Tags_case()) {
            case Specification::CoreMLModels::WordTagger::kStringTags:
                numTags = wordTagger.stringtags().vector_size();
                break;
            case Specification::CoreMLModels::WordTagger::TAGS_NOT_SET:
                numTags = -1;
                break;
        }
        
        if (numTags <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output tags not set. Must have at least one tag");
        }
        
        if (wordTagger.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }